

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001951b0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001951b7._0_1_ = '-';
    uRam00000000001951b7._1_1_ = '-';
    uRam00000000001951b7._2_1_ = '-';
    uRam00000000001951b7._3_1_ = '-';
    uRam00000000001951b7._4_1_ = '-';
    uRam00000000001951b7._5_1_ = '-';
    uRam00000000001951b7._6_1_ = '-';
    uRam00000000001951b7._7_1_ = '-';
    DAT_001951a0 = '-';
    DAT_001951a0_1._0_1_ = '-';
    DAT_001951a0_1._1_1_ = '-';
    DAT_001951a0_1._2_1_ = '-';
    DAT_001951a0_1._3_1_ = '-';
    DAT_001951a0_1._4_1_ = '-';
    DAT_001951a0_1._5_1_ = '-';
    DAT_001951a0_1._6_1_ = '-';
    uRam00000000001951a8 = 0x2d2d2d2d2d2d2d;
    DAT_001951af = 0x2d;
    DAT_00195190 = '-';
    DAT_00195190_1._0_1_ = '-';
    DAT_00195190_1._1_1_ = '-';
    DAT_00195190_1._2_1_ = '-';
    DAT_00195190_1._3_1_ = '-';
    DAT_00195190_1._4_1_ = '-';
    DAT_00195190_1._5_1_ = '-';
    DAT_00195190_1._6_1_ = '-';
    uRam0000000000195198._0_1_ = '-';
    uRam0000000000195198._1_1_ = '-';
    uRam0000000000195198._2_1_ = '-';
    uRam0000000000195198._3_1_ = '-';
    uRam0000000000195198._4_1_ = '-';
    uRam0000000000195198._5_1_ = '-';
    uRam0000000000195198._6_1_ = '-';
    uRam0000000000195198._7_1_ = '-';
    DAT_00195180 = '-';
    DAT_00195180_1._0_1_ = '-';
    DAT_00195180_1._1_1_ = '-';
    DAT_00195180_1._2_1_ = '-';
    DAT_00195180_1._3_1_ = '-';
    DAT_00195180_1._4_1_ = '-';
    DAT_00195180_1._5_1_ = '-';
    DAT_00195180_1._6_1_ = '-';
    uRam0000000000195188._0_1_ = '-';
    uRam0000000000195188._1_1_ = '-';
    uRam0000000000195188._2_1_ = '-';
    uRam0000000000195188._3_1_ = '-';
    uRam0000000000195188._4_1_ = '-';
    uRam0000000000195188._5_1_ = '-';
    uRam0000000000195188._6_1_ = '-';
    uRam0000000000195188._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000195178._0_1_ = '-';
    uRam0000000000195178._1_1_ = '-';
    uRam0000000000195178._2_1_ = '-';
    uRam0000000000195178._3_1_ = '-';
    uRam0000000000195178._4_1_ = '-';
    uRam0000000000195178._5_1_ = '-';
    uRam0000000000195178._6_1_ = '-';
    uRam0000000000195178._7_1_ = '-';
    DAT_001951bf = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}